

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O0

bool __thiscall FxExpression::IsObject(FxExpression *this)

{
  bool bVar1;
  bool local_11;
  FxExpression *this_local;
  
  bVar1 = DObject::IsKindOf((DObject *)this->ValueType,PPointer::RegistrationInfo.MyClass);
  local_11 = false;
  if (bVar1) {
    bVar1 = DObject::IsKindOf((DObject *)this->ValueType,PClassPointer::RegistrationInfo.MyClass);
    local_11 = false;
    if ((!bVar1) && (local_11 = false, (PPointer *)this->ValueType != TypeNullPtr)) {
      local_11 = DObject::IsKindOf((DObject *)
                                   this->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject,
                                   PClass::RegistrationInfo.MyClass);
    }
  }
  return local_11;
}

Assistant:

bool IsObject() const { return ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && !ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) && ValueType != TypeNullPtr && static_cast<PPointer*>(ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(PClass)); }